

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddKeyAnalogEvent(ImGuiIO *this,ImGuiKey key,bool down,float analog_value)

{
  int *piVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ulong uVar5;
  ImGuiKeyData *pIVar6;
  ImGuiInputEvent *pIVar7;
  ImGuiKeyData *pIVar8;
  float *pfVar9;
  ImGuiInputEvent *pIVar10;
  ImGuiContext *g;
  int iVar11;
  long lVar12;
  
  pIVar3 = GImGui;
  if ((key != ImGuiKey_KeysData_OFFSET) && (this->AppAcceptingEvents == true)) {
    this->BackendUsingLegacyKeyArrays = '\0';
    if (key - ImGuiKey_GamepadStart < 0x18) {
      this->BackendUsingLegacyNavInputArray = false;
    }
    iVar11 = (pIVar3->InputEventsQueue).Size;
    lVar12 = (long)iVar11;
    if (0 < lVar12) {
      uVar5 = lVar12 + 1;
      pIVar7 = (pIVar3->InputEventsQueue).Data + lVar12;
      do {
        pIVar10 = pIVar7 + -1;
        if ((pIVar10->Type == ImGuiInputEventType_Key) &&
           (pIVar7[-1].field_2.MouseButton.Button == key)) goto LAB_001dc599;
        uVar5 = uVar5 - 1;
        pIVar7 = pIVar10;
      } while (1 < uVar5);
    }
    pIVar10 = (ImGuiInputEvent *)0x0;
LAB_001dc599:
    pIVar6 = ImGui::GetKeyData(key);
    pIVar8 = (ImGuiKeyData *)((long)&pIVar10->field_2 + 4);
    if (pIVar10 == (ImGuiInputEvent *)0x0) {
      pIVar8 = pIVar6;
    }
    if (pIVar8->Down == down) {
      pfVar9 = &(pIVar10->field_2).Key.AnalogValue;
      if (pIVar10 == (ImGuiInputEvent *)0x0) {
        pfVar9 = &pIVar6->AnalogValue;
      }
      if ((*pfVar9 == analog_value) && (!NAN(*pfVar9) && !NAN(analog_value))) {
        return;
      }
    }
    if (iVar11 == (pIVar3->InputEventsQueue).Capacity) {
      if (iVar11 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar11 / 2 + iVar11;
      }
      iVar2 = iVar11 + 1;
      if (iVar11 + 1 < iVar4) {
        iVar2 = iVar4;
      }
      piVar1 = &(pIVar3->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      pIVar7 = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar2 * 0x18,GImAllocatorUserData);
      pIVar10 = (pIVar3->InputEventsQueue).Data;
      if (pIVar10 != (ImGuiInputEvent *)0x0) {
        memcpy(pIVar7,pIVar10,(long)(pIVar3->InputEventsQueue).Size * 0x18);
        pIVar10 = (pIVar3->InputEventsQueue).Data;
        if ((pIVar10 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar10,GImAllocatorUserData);
      }
      (pIVar3->InputEventsQueue).Data = pIVar7;
      (pIVar3->InputEventsQueue).Capacity = iVar2;
      iVar11 = (pIVar3->InputEventsQueue).Size;
    }
    else {
      pIVar7 = (pIVar3->InputEventsQueue).Data;
    }
    pIVar7[iVar11].Type = ImGuiInputEventType_Key;
    pIVar7[iVar11].Source = (key - ImGuiKey_GamepadStart < 0x18) + ImGuiInputSource_Keyboard;
    pIVar7[iVar11].field_2.Key.Key = key;
    pIVar7[iVar11].field_2.MouseButton.Down = down;
    *(undefined2 *)((long)&pIVar7[iVar11].field_2 + 5) = 0;
    *(undefined1 *)((long)&pIVar7[iVar11].field_2 + 7) = 0;
    pIVar7[iVar11].field_2.Key.AnalogValue = analog_value;
    *(undefined4 *)&pIVar7[iVar11].AddedByTestEngine = 0;
    (pIVar3->InputEventsQueue).Size = (pIVar3->InputEventsQueue).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddKeyAnalogEvent(ImGuiKey key, bool down, float analog_value)
{
    //if (e->Down) { IMGUI_DEBUG_LOG_IO("AddKeyEvent() Key='%s' %d, NativeKeycode = %d, NativeScancode = %d\n", ImGui::GetKeyName(e->Key), e->Down, e->NativeKeycode, e->NativeScancode); }
    if (key == ImGuiKey_None || !AppAcceptingEvents)
        return;
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(ImGui::IsNamedKeyOrModKey(key)); // Backend needs to pass a valid ImGuiKey_ constant. 0..511 values are legacy native key codes which are not accepted by this API.
    IM_ASSERT(!ImGui::IsAliasKey(key)); // Backend cannot submit ImGuiKey_MouseXXX values they are automatically inferred from AddMouseXXX() events.

    // Verify that backend isn't mixing up using new io.AddKeyEvent() api and old io.KeysDown[] + io.KeyMap[] data.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((BackendUsingLegacyKeyArrays == -1 || BackendUsingLegacyKeyArrays == 0) && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    if (BackendUsingLegacyKeyArrays == -1)
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            IM_ASSERT(KeyMap[n] == -1 && "Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!");
    BackendUsingLegacyKeyArrays = 0;
#endif
    if (ImGui::IsGamepadKey(key))
        BackendUsingLegacyNavInputArray = false;

    // Filter duplicate (in particular: key mods and gamepad analog values are commonly spammed)
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_Key, (int)key);
    const ImGuiKeyData* key_data = ImGui::GetKeyData(key);
    const bool latest_key_down = latest_event ? latest_event->Key.Down : key_data->Down;
    const float latest_key_analog = latest_event ? latest_event->Key.AnalogValue : key_data->AnalogValue;
    if (latest_key_down == down && latest_key_analog == analog_value)
        return;

    // Add event
    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Key;
    e.Source = ImGui::IsGamepadKey(key) ? ImGuiInputSource_Gamepad : ImGuiInputSource_Keyboard;
    e.Key.Key = key;
    e.Key.Down = down;
    e.Key.AnalogValue = analog_value;
    g.InputEventsQueue.push_back(e);
}